

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

int __thiscall QCompletionModel::rowCount(QCompletionModel *this,QModelIndex *parent)

{
  long lVar1;
  QCompletionEngine *pQVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  
  lVar1 = *(long *)&this->field_0x8;
  if (((-1 < parent->r) && (-1 < parent->c)) && ((parent->m).ptr != (QAbstractItemModel *)0x0)) {
    return 0;
  }
  if (this->showAll != true) {
    iVar4 = completionCount(this);
    return iVar4;
  }
  pQVar2 = (this->engine).d;
  if ((pQVar2->curParts).d.size != 1) {
    if ((pQVar2->curMatch).indices.v == true) {
      iVar4 = (int)(pQVar2->curMatch).indices.vector.d.size;
    }
    else {
      iVar4 = ((pQVar2->curMatch).indices.t - (pQVar2->curMatch).indices.f) + 1;
    }
    if ((pQVar2->historyMatch).indices.v == true) {
      iVar5 = (int)(pQVar2->historyMatch).indices.vector.d.size;
    }
    else {
      iVar5 = ((pQVar2->historyMatch).indices.t - (pQVar2->historyMatch).indices.f) + 1;
    }
    if (iVar5 + iVar4 == 0) {
      if ((pQVar2->curParent).r < 0) {
        return 0;
      }
      if ((pQVar2->curParent).c < 0) {
        return 0;
      }
      if ((pQVar2->curParent).m.ptr == (QAbstractItemModel *)0x0) {
        return 0;
      }
    }
  }
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           *)(lVar1 + 0xd8));
  plVar3 = *(long **)(lVar1 + 0xd8);
  iVar4 = (**(code **)(*plVar3 + 0x78))(plVar3,&((this->engine).d)->curParent);
  return iVar4;
}

Assistant:

int QCompletionModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QCompletionModel);
    if (parent.isValid())
        return 0;

    if (showAll) {
        // Show all items below current parent, even if we have no valid matches
        if (engine->curParts.size() != 1  && !engine->matchCount()
            && !engine->curParent.isValid())
            return 0;
        return d->model->rowCount(engine->curParent);
    }

    return completionCount();
}